

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::order(Forth *this)

{
  WriteTarget WVar1;
  pointer piVar2;
  ostream *poVar3;
  pointer piVar4;
  
  piVar2 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (piVar4 = (this->searchOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; WVar1 = this->writeToTarget, piVar4 != piVar2;
      piVar4 = piVar4 + -1) {
    if (WVar1 == ToStdCout) {
      poVar3 = std::operator<<((ostream *)&std::cout,"wid");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,piVar4[-1]);
      std::operator<<(poVar3," ");
      std::ostream::flush();
    }
    else if (WVar1 == ToString) {
      poVar3 = std::operator<<((ostream *)&this->field_0x20,"wid");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,piVar4[-1]);
      std::operator<<(poVar3," ");
    }
  }
  if (WVar1 != ToString) {
    if (WVar1 == ToStdCout) {
      poVar3 = std::operator<<((ostream *)&std::cout,"wid");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->searchOrderCurrent);
      std::operator<<(poVar3," ");
      std::ostream::flush();
      return;
    }
    return;
  }
  poVar3 = std::operator<<((ostream *)&this->field_0x20,"wid");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->searchOrderCurrent);
  std::operator<<(poVar3," ");
  return;
}

Assistant:

void order(){
			for(auto it=searchOrder.rbegin(),itEnd=searchOrder.rend();it!=itEnd;++it){
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				
				switch (writeToTarget) {
				case ToString:
					std_cout << "wid" << (*it)<< " ";
					break;
				case ToStdCout:
					std::cout << "wid" << (*it)<< " ";;
					std::cout.flush();
					break;
				default:
					break;
				}
#endif
			}					
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT			
			switch (writeToTarget) {
			case ToString:
				std_cout << "wid" << searchOrderCurrent << " ";
				break;
			case ToStdCout:
				std::cout << "wid" << searchOrderCurrent << " ";;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}